

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O0

void __thiscall cfd::core::AdaptorProof::AdaptorProof(AdaptorProof *this,ByteData *data)

{
  size_t sVar1;
  CfdException *this_00;
  allocator local_49;
  string local_48;
  ByteData *local_18;
  ByteData *data_local;
  AdaptorProof *this_local;
  
  local_18 = data;
  data_local = &this->data_;
  ByteData::ByteData(&this->data_,data);
  sVar1 = ByteData::GetDataSize(&this->data_);
  if (sVar1 != 0x61) {
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_48,"Invalid adaptor proof data.",&local_49);
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_48);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

AdaptorProof::AdaptorProof(const ByteData &data) : data_(data) {
  if ((data_.GetDataSize()) != AdaptorProof::kAdaptorProofSize) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid adaptor proof data.");
  }
}